

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O0

BOOL PROCEndProcess(HANDLE hProcess,UINT uExitCode,BOOL bTerminateUnconditionally)

{
  DWORD __pid;
  DWORD DVar1;
  int iVar2;
  int *piVar3;
  BOOL local_20;
  BOOL ret;
  DWORD dwProcessId;
  BOOL bTerminateUnconditionally_local;
  UINT uExitCode_local;
  HANDLE hProcess_local;
  
  local_20 = 0;
  __pid = PROCGetProcessIDFromHandle(hProcess);
  if (__pid == 0) {
    SetLastError(6);
  }
  else {
    DVar1 = GetCurrentProcessId();
    if (__pid == DVar1) {
      if (bTerminateUnconditionally == 0) {
        if (((uExitCode & 0xff) != uExitCode) && ((PAL_InitializeChakraCoreCalled & 1U) == 0)) {
          abort();
        }
      }
      else if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      CorUnix::TerminateCurrentProcessNoExit(bTerminateUnconditionally);
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      PAL_Leave(PAL_BoundaryBottom);
      if (bTerminateUnconditionally == 0) {
        exit(uExitCode);
      }
      abort();
    }
    if ((uExitCode != 0) && ((PAL_InitializeChakraCoreCalled & 1U) == 0)) {
      abort();
    }
    iVar2 = kill(__pid,9);
    if (iVar2 == 0) {
      local_20 = 1;
    }
    else {
      piVar3 = __errno_location();
      if (*piVar3 == 1) {
        SetLastError(5);
      }
      else if (*piVar3 == 3) {
        SetLastError(6);
      }
      else {
        fprintf(_stderr,"] %s %s:%d","PROCEndProcess",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/process.cpp"
                ,0x4ed);
        fprintf(_stderr,(char *)0x0);
        SetLastError(0x54f);
      }
    }
  }
  return local_20;
}

Assistant:

static BOOL PROCEndProcess(HANDLE hProcess, UINT uExitCode, BOOL bTerminateUnconditionally)
{
    DWORD dwProcessId;
    BOOL ret = FALSE;

    dwProcessId = PROCGetProcessIDFromHandle(hProcess);
    if (dwProcessId == 0)
    {
        SetLastError(ERROR_INVALID_HANDLE);
    }
    else if(dwProcessId != GetCurrentProcessId())
    {
        if (uExitCode != 0)
            WARN("exit code 0x%x ignored for external process.\n", uExitCode);

        if (kill(dwProcessId, SIGKILL) == 0)
        {
            ret = TRUE;
        }
        else
        {
            switch (errno) {
            case ESRCH:
                SetLastError(ERROR_INVALID_HANDLE);
                break;
            case EPERM:
                SetLastError(ERROR_ACCESS_DENIED);
                break;
            default:
                // Unexpected failure.
                ASSERT(FALSE);
                SetLastError(ERROR_INTERNAL_ERROR);
                break;
            }
        }
    }
    else
    {
        // WARN/ERROR before starting the termination process and/or leaving the PAL.
        if (bTerminateUnconditionally)
        {
            WARN("exit code 0x%x ignored for terminate.\n", uExitCode);
        }
        else if ((uExitCode & 0xff) != uExitCode)
        {
            // TODO: Convert uExitCodes into sysexits(3)?
            ERROR("exit() only supports the lower 8-bits of an exit code. "
                "status will only see error 0x%x instead of 0x%x.\n", uExitCode & 0xff, uExitCode);
        }

        TerminateCurrentProcessNoExit(bTerminateUnconditionally);

        LOGEXIT("PROCEndProcess will not return\n");

        // exit() runs atexit handlers possibly registered by foreign code.
        // The right thing to do here is to leave the PAL.  If our client
        // registered our own PAL_Terminate with atexit(), the latter will
        // explicitly re-enter us.
        PAL_Leave(PAL_BoundaryBottom);

        if (bTerminateUnconditionally)
        {
            // abort() has the semantics that
            // (1) it doesn't run atexit handlers
            // (2) can invoke CrashReporter or produce a coredump,
            // which is appropriate for TerminateProcess calls

            // If this turns out to be inappropriate for some case, where we
            // call TerminateProcess vs. ExitProcess, then there needs to be
            // a CLR wrapper for TerminateProcess and some exposure for PAL_abort()
            // to selectively use that in all but those cases.

            abort();
        }
        else
        {
            exit(uExitCode);
        }

        ASSERT(FALSE); // we shouldn't get here
    }

    return ret;
}